

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateDataAndSubDataErrorsTest::PrepareObjects
          (InvalidateDataAndSubDataErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 *puVar8;
  uint uVar9;
  bool bVar10;
  GLint max_color_attachments;
  int local_1c;
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  this->m_fbo_attachment_valid = 0x8ce0;
  (**(code **)(lVar7 + 0x6d0))(1,&this->m_fbo_valid);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x174a);
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x174d);
  (**(code **)(lVar7 + 0x6e8))(1,&this->m_rbo);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1750);
  (**(code **)(lVar7 + 0xa0))(0x8d41,this->m_rbo);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1753);
  (**(code **)(lVar7 + 0x1238))(0x8d41,0x8058,1,1);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1756);
  (**(code **)(lVar7 + 0x688))(0x8d40,this->m_fbo_attachment_valid,0x8d41,this->m_rbo);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1759);
  iVar3 = (**(code **)(lVar7 + 0x170))(0x8d40);
  if (iVar3 == 0x8cd5) {
    do {
      pcVar1 = *(code **)(lVar7 + 0xc88);
      this->m_fbo_invalid = this->m_fbo_invalid + 1;
      cVar2 = (*pcVar1)();
    } while (cVar2 != '\0');
    uVar5 = this->m_fbo_attachment_invalid;
    uVar9 = 0x8ce1;
    if (0x8ce1 < uVar5) {
      uVar9 = uVar5;
    }
    while (uVar5 != uVar9) {
      this->m_fbo_attachment_invalid = uVar5 + 1;
      bVar10 = uVar5 != 0x8219;
      uVar5 = 0x821a;
      if (bVar10) {
        local_1c = 8;
        (**(code **)(lVar7 + 0x868))(0x8cdf,&local_1c);
        dVar4 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar4,"glGetIntegerv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x177e);
        this->m_color_attachment_invalid = local_1c + 0x8ce0;
        for (GVar6 = this->m_default_attachment_invalid; (GVar6 - 0x3ff < 4 || (GVar6 - 0x17ff < 3))
            ; GVar6 = GVar6 + 1) {
        }
        this->m_default_attachment_invalid = GVar6 + 1;
        return;
      }
    }
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

void InvalidateDataAndSubDataErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid attachments. */
	m_fbo_attachment_valid = GL_COLOR_ATTACHMENT0;

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genRenderbuffers(1, &m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, m_fbo_attachment_valid, GL_RENDERBUFFER, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

	if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
	{
		throw 0;
	}

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;

	/* Invalid framebuffer object attachment. */
	while (true)
	{
		if (GL_COLOR_ATTACHMENT0 < m_fbo_attachment_invalid)
		{
			/* If this unlikely happen this mean that we cannot create invalid attachment which is not DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT and
			 GL_COLOR_ATTACHMENTm where m IS any number (for m < MAX_COLOR_ATTACHMENTS attachments are valid, and for m >= MAX_COLOR_ATTACHMENTS is invalid, but
			 INVALID_OPERATION shall be generated instead of INVALID_ENUM. Such a situation may need change in the test or in the specification. */
			throw 0;
		}

		switch (++m_fbo_attachment_invalid)
		{
		case GL_DEPTH_ATTACHMENT:
		case GL_STENCIL_ATTACHMENT:
		case GL_DEPTH_STENCIL_ATTACHMENT:
			continue;
		};

		break;
	};

	/* Invalid color attachment. */
	glw::GLint max_color_attachments = 8; /* Spec default. */

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	m_color_attachment_invalid = GL_COLOR_ATTACHMENT0 + max_color_attachments;

	/* Invalid default attachment. */
	while (true)
	{
		switch (++m_default_attachment_invalid)
		{
		case GL_FRONT_LEFT:
		case GL_FRONT_RIGHT:
		case GL_BACK_LEFT:
		case GL_BACK_RIGHT:
		case GL_COLOR:
		case GL_DEPTH:
		case GL_STENCIL:
			continue;
		};

		break;
	}
}